

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

mat<double,_3,_3> *
linalg::qmat<double>(mat<double,_3,_3> *__return_storage_ptr__,vec<double,_4> *q)

{
  vec<double,_3> local_58;
  vec<double,_3> local_40;
  vec<double,_3> local_28;
  vec<double,_4> *local_10;
  vec<double,_4> *q_local;
  
  local_10 = q;
  qxdir<double>(&local_28,q);
  qydir<double>(&local_40,local_10);
  qzdir<double>(&local_58,local_10);
  mat<double,_3,_3>::mat(__return_storage_ptr__,&local_28,&local_40,&local_58);
  return __return_storage_ptr__;
}

Assistant:

T                    qangle(const vec<T,4> & q)                          { return std::atan2(length(q.xyz()), q.w)*2; }